

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

Vec_Int_t * findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone,Vec_Int_t *vHintMonotone)

{
  int iVar1;
  int iVar2;
  int local_30;
  int i;
  int iElem;
  Vec_Int_t *vCandMonotone;
  Vec_Int_t *vHintMonotone_local;
  Vec_Int_t *vKnownMonotone_local;
  
  vKnownMonotone_local = vHintMonotone;
  if ((vKnownMonotone != (Vec_Int_t *)0x0) && (iVar1 = Vec_IntSize(vKnownMonotone), 0 < iVar1)) {
    vKnownMonotone_local = Vec_IntAlloc(0);
    for (local_30 = 0; iVar1 = Vec_IntSize(vHintMonotone), local_30 < iVar1; local_30 = local_30 + 1
        ) {
      iVar1 = Vec_IntEntry(vHintMonotone,local_30);
      iVar2 = Vec_IntFind(vKnownMonotone,iVar1);
      if (iVar2 == -1) {
        Vec_IntPush(vKnownMonotone_local,iVar1);
      }
    }
  }
  return vKnownMonotone_local;
}

Assistant:

Vec_Int_t *findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone, Vec_Int_t *vHintMonotone)
{
    Vec_Int_t *vCandMonotone;
    int iElem, i;

    if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
        return vHintMonotone;
    vCandMonotone = Vec_IntAlloc(0);
    Vec_IntForEachEntry( vHintMonotone, iElem, i )
    {
        if( Vec_IntFind( vKnownMonotone, iElem ) == -1 )
            Vec_IntPush( vCandMonotone, iElem );
    }
    
    return vCandMonotone;
}